

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O0

int get_socket_nonblocking(libssh2_socket_t sockfd)

{
  uint uVar1;
  int flags;
  libssh2_socket_t sockfd_local;
  
  uVar1 = fcntl(sockfd,3,0);
  if (uVar1 == 0xffffffff) {
    flags = 1;
  }
  else {
    flags = uVar1 & 0x800;
  }
  return flags;
}

Assistant:

static int
get_socket_nonblocking(libssh2_socket_t sockfd)
{                               /* operate on this */
#ifdef HAVE_O_NONBLOCK
    /* most recent unix versions */
    int flags = fcntl(sockfd, F_GETFL, 0);

    if(flags == -1) {
        /* Assume blocking on error */
        return 1;
    }
    return (flags & O_NONBLOCK);
#elif defined(HAVE_SO_NONBLOCK)
    /* BeOS */
    long b;
    if(getsockopt(sockfd, SOL_SOCKET, SO_NONBLOCK, &b, sizeof(b))) {
        /* Assume blocking on error */
        return 1;
    }
    return (int) b;
#elif defined(SO_STATE) && defined(__VMS)
    /* VMS TCP/IP Services */

    size_t sockstat = 0;
    int    callstat = 0;
    size_t size = sizeof(int);

    callstat = getsockopt(sockfd, SOL_SOCKET, SO_STATE,
                          (char *)&sockstat, &size);
    if(callstat == -1) {
        return 0;
    }
    if((sockstat&SS_NBIO) != 0) {
        return 1;
    }
    return 0;
#elif defined(_WIN32)
    unsigned int option_value;
    socklen_t option_len = sizeof(option_value);

    if(getsockopt(sockfd, SOL_SOCKET, SO_ERROR,
                  (void *) &option_value, &option_len)) {
        /* Assume blocking on error */
        return 1;
    }
    return (int) option_value;
#else
    (void)sockfd;
    return 1;                   /* returns blocking */
#endif
}